

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kex.c
# Opt level: O2

uchar * kex_agree_instr(uchar *haystack,unsigned_long haystack_len,uchar *needle,
                       unsigned_long needle_len)

{
  int iVar1;
  char *pcVar2;
  uchar *__s;
  
  if (haystack_len < needle_len) {
    return (uchar *)0x0;
  }
  iVar1 = strncmp((char *)haystack,(char *)needle,needle_len);
  if ((iVar1 != 0) || ((needle_len != haystack_len && (haystack[needle_len] != ',')))) {
    __s = haystack;
    while (pcVar2 = strchr((char *)__s,0x2c), pcVar2 != (char *)0x0) {
      if (haystack + (haystack_len - (long)pcVar2) <= needle_len) {
        return (uchar *)0x0;
      }
      __s = (uchar *)(pcVar2 + 1);
      iVar1 = strncmp((char *)__s,(char *)needle,needle_len);
      if (iVar1 == 0) {
        if (__s + (needle_len - (long)haystack) == (uchar *)haystack_len) {
          return __s;
        }
        if (__s[needle_len] == ',') {
          return __s;
        }
      }
    }
    haystack = (uchar *)0x0;
  }
  return haystack;
}

Assistant:

static unsigned char *
kex_agree_instr(unsigned char *haystack, unsigned long haystack_len,
                const unsigned char *needle, unsigned long needle_len)
{
    unsigned char *s;

    /* Haystack too short to bother trying */
    if (haystack_len < needle_len) {
        return NULL;
    }

    /* Needle at start of haystack */
    if ((strncmp((char *) haystack, (char *) needle, needle_len) == 0) &&
        (needle_len == haystack_len || haystack[needle_len] == ',')) {
        return haystack;
    }

    s = haystack;
    /* Search until we run out of comas or we run out of haystack,
       whichever comes first */
    while ((s = (unsigned char *) strchr((char *) s, ','))
           && ((haystack_len - (s - haystack)) > needle_len)) {
        s++;
        /* Needle at X position */
        if ((strncmp((char *) s, (char *) needle, needle_len) == 0) &&
            (((s - haystack) + needle_len) == haystack_len
             || s[needle_len] == ',')) {
            return s;
        }
    }

    return NULL;
}